

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_78;
  char *local_70;
  ulong local_68;
  long local_60;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  ulong local_28;
  long local_20;
  undefined8 local_18;
  char *local_10;
  
  local_68 = (ulong)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_40 = **(undefined8 **)(this + 8);
  local_48 = (*(undefined8 **)(this + 8))[1];
  local_28 = (ulong)*(ushort *)(*(long *)(**(long **)(this + 0x10) + 8) + 2);
  local_78 = 0xb;
  local_70 = "Enum type \"";
  local_60 = ~local_68 + *(long *)(**(long **)this + 8);
  local_58 = 0x16;
  local_50 = "\" has no value named \"";
  local_38 = 0xe;
  local_30 = "\" for option \"";
  local_20 = ~local_28 + *(long *)(**(long **)(this + 0x10) + 8);
  local_18 = 0x32;
  local_10 = "\". This appears to be a value from a sibling type.";
  pieces._M_len = local_48;
  pieces._M_array = (iterator)0x7;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_78,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}